

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckLineLength.cxx
# Opt level: O2

bool __thiscall
kws::Parser::CheckLineLength(Parser *this,unsigned_long max,bool checkHeader,bool doErrorCheck)

{
  pointer puVar1;
  char cVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  ulong local_290;
  ulong local_288;
  undefined4 local_27c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_278;
  unsigned_long local_270;
  ulong local_268;
  Parser *local_260;
  char localval [21];
  ifstream file;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [30];
  
  local_27c = (undefined4)CONCAT71(in_register_00000009,doErrorCheck);
  this->m_TestsDone[0] = true;
  pcVar3 = (char *)operator_new__(0xff);
  local_270 = max;
  snprintf(pcVar3,0xff,"Line Length = %ld max chars",max);
  std::__cxx11::string::assign((char *)this->m_TestsDescription);
  operator_delete__(pcVar3);
  puVar1 = (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  if (checkHeader) {
    local_290 = 0;
  }
  else if ((this->m_HeaderFilename)._M_string_length == 0) {
    local_290 = std::__cxx11::string::find((char *)&this->m_Buffer,0x155500);
    if (local_290 == 0xffffffffffffffff) {
      local_290 = 0;
    }
  }
  else {
    std::ifstream::ifstream(&file);
    std::ifstream::open((char *)&file,(_Ios_Openmode)(this->m_HeaderFilename)._M_dataplus._M_p);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cout,"CheckLineLength() - Cannot open file: ");
      poVar4 = std::operator<<(poVar4,(string *)&this->m_HeaderFilename);
      std::endl<char,std::char_traits<char>>(poVar4);
      local_290 = 0;
    }
    else {
      std::istream::seekg((long)&file,_S_beg);
      local_290 = std::istream::tellg();
      std::ifstream::close();
    }
    std::ifstream::~ifstream(&file);
  }
  local_278 = &this->m_Positions;
  pcVar3 = (this->m_Buffer)._M_dataplus._M_p;
  uVar5 = (this->m_Buffer)._M_string_length;
  _file = 0;
  local_260 = this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (local_278,(unsigned_long *)&file);
  uVar6 = 1;
  bVar9 = 0;
  local_288 = 0;
  uVar7 = 0;
  local_268 = uVar5;
  while (local_288 < uVar5) {
    if (*pcVar3 == '\n') {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_278,&local_288);
      if ((((char)local_27c != '\0') && (lVar8 = ~uVar7 + local_288, (long)local_270 < lVar8)) &&
         (local_290 < local_288)) {
        local_220._M_p = (pointer)local_210;
        local_218 = 0;
        local_210[0]._M_local_buf[0] = '\0';
        _file = uVar6;
        std::__cxx11::string::assign((char *)&local_220);
        snprintf(localval,0x15,"%ld",lVar8);
        std::__cxx11::string::append((char *)&local_220);
        std::__cxx11::string::append((char *)&local_220);
        snprintf(localval,0x15,"%ld",local_270);
        std::__cxx11::string::append((char *)&local_220);
        std::__cxx11::string::append((char *)&local_220);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&local_260->m_ErrorList,(value_type *)&file);
        std::__cxx11::string::~string((string *)&local_220);
        bVar9 = 1;
        uVar5 = local_268;
      }
      local_288 = local_288 + 1;
      uVar6 = uVar6 + 1;
      uVar7 = local_288;
    }
    else {
      local_288 = local_288 + 1;
    }
    pcVar3 = pcVar3 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_278,&local_288);
  return (bool)(~bVar9 & 1);
}

Assistant:

bool Parser::CheckLineLength(unsigned long max,bool checkHeader, bool doErrorCheck)
{
  m_TestsDone[LINE_LENGTH] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Line Length = %ld max chars",max);
  m_TestsDescription[LINE_LENGTH] = val;
  delete [] val;

  m_Positions.clear();
  bool hasError = false;

  size_t fileSize = 0;

  // If we do not want to check the header
  if(!checkHeader)
    {
    if (!m_HeaderFilename.empty()) {
      std::ifstream file;
      file.open(m_HeaderFilename.c_str(), std::ios::binary | std::ios::in);
      if(!file.is_open())
        {
        std::cout << "CheckLineLength() - Cannot open file: "
                  << m_HeaderFilename << std::endl;
        }
      else
        {
        file.seekg(0,std::ios::end);
        fileSize = file.tellg();
        file.close();
        }
    } else {
      // we look at the first '*/' in the file which indicated the end of the current header
      // This assume that there is an header at some point
      size_t endHeader = m_Buffer.find("*/",0);
      if(endHeader != std::string::npos)
        {
        fileSize = endHeader;
        }
    }
    }

  size_t cc;
  const char* inch = m_Buffer.c_str();
  size_t inStrSize = m_Buffer.size();
  long int line_start = 0;
  long int line_end = 0;
  long int line_count = 1;
  m_Positions.push_back(0);
  for ( cc = 0; cc < inStrSize; ++ cc )
    {
    if ( *inch == '\n' )
      {
      m_Positions.push_back(cc);
      line_end = static_cast<long int>(cc);
      long int line_length = line_end - line_start-1;
      if(doErrorCheck && (line_length > (long int)max && cc>fileSize))
        {
        Error error;
        error.line = line_count;
        error.line2 = error.line;
        error.number = LINE_LENGTH;
        error.description = "Line length exceed ";
        constexpr size_t length = 21;
        char localval[length];
        snprintf(localval,length,"%ld",line_length);
        error.description += localval;
        error.description += " (max=";
        snprintf(localval,length,"%ld",max);
        error.description += localval;
        error.description += ")";
        m_ErrorList.push_back(error);
        hasError = true;
        }
      line_start = static_cast<long int>(cc) + 1;
      line_count ++;
      }
    inch ++;
    }
  m_Positions.push_back(cc);

  return !hasError;
}